

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O3

void __thiscall gdsPATH::gdsPATH(gdsPATH *this)

{
  this->width = 0;
  this->plex = 0;
  this->layer = 0;
  this->dataType = 0;
  this->pathtype = 0;
  (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->propattr = 0;
  (this->propvalue)._M_dataplus._M_p = (pointer)&(this->propvalue).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->propvalue,"");
  return;
}

Assistant:

gdsPATH(){}